

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergingAlgorithm.cpp
# Opt level: O2

void __thiscall van_kampen::MergingAlgorithm::MergingAlgorithm(MergingAlgorithm *this)

{
  __shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  DiagrammGeneratingAlgorithm::DiagrammGeneratingAlgorithm(&this->super_DiagrammGeneratingAlgorithm)
  ;
  (this->super_DiagrammGeneratingAlgorithm)._vptr_DiagrammGeneratingAlgorithm =
       (_func_int **)&PTR_generate_00177cd8;
  this->limit = 0;
  this->quiet = false;
  std::__shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             &(this->super_DiagrammGeneratingAlgorithm).graph_.
              super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>);
  Diagramm::Diagramm(&this->result_,(shared_ptr<van_kampen::Graph> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

MergingAlgorithm::MergingAlgorithm()
    : result_(graph_) {}